

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

void __thiscall
glcts::ShaderBitfieldOperationCaseUnaryUint::ShaderBitfieldOperationCaseUnaryUint
          (ShaderBitfieldOperationCaseUnaryUint *this,Context *context,char *name,
          GLSLVersion glslVersion,char *funcName,UnaryUFunc func,Data *data,int components,
          char *testStatement)

{
  ulong uVar1;
  string *psVar2;
  size_t pos;
  UnaryUFunc func_local;
  char *funcName_local;
  GLSLVersion glslVersion_local;
  char *name_local;
  Context *context_local;
  ShaderBitfieldOperationCaseUnaryUint *this_local;
  
  ShaderBitfieldOperationCase::ShaderBitfieldOperationCase
            (&this->super_ShaderBitfieldOperationCase,context,name,"",glslVersion,data,testStatement
            );
  (this->super_ShaderBitfieldOperationCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ShaderBitfieldOperationCaseUnaryUint_0325d640;
  this->m_components = components;
  this->m_func = func;
  psVar2 = &(this->super_ShaderBitfieldOperationCase).m_testStatement;
  uVar1 = std::__cxx11::string::find((char *)psVar2,0x2b9bf1e);
  std::__cxx11::string::replace((ulong)psVar2,uVar1,&DAT_00000004);
  return;
}

Assistant:

ShaderBitfieldOperationCaseUnaryUint(Context& context, const char* name, glu::GLSLVersion glslVersion,
										 char const* funcName, UnaryUFunc func, Data const& data, int components,
										 char const* testStatement)
		: ShaderBitfieldOperationCase(context, name, "", glslVersion, data, testStatement)
		, m_components(components)
		, m_func(func)
	{
		size_t pos = m_testStatement.find("func");
		m_testStatement.replace(pos, 4, funcName);
	}